

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O0

opj_bool opj_stream_flush(opj_stream_private_t *p_stream,opj_event_mgr_t *p_event_mgr)

{
  uint uVar1;
  opj_event_mgr_t *in_RSI;
  undefined8 *in_RDI;
  OPJ_SIZE_T l_current_write_nb_bytes;
  
  in_RDI[7] = in_RDI[6];
  while( true ) {
    if (*(int *)(in_RDI + 10) == 0) {
      in_RDI[7] = in_RDI[6];
      return 0;
    }
    uVar1 = (*(code *)in_RDI[3])(in_RDI[7],*(undefined4 *)(in_RDI + 10),*in_RDI);
    if (uVar1 == 0xffffffff) break;
    in_RDI[7] = in_RDI[7] + (ulong)uVar1;
    *(uint *)(in_RDI + 10) = *(int *)(in_RDI + 10) - uVar1;
  }
  *(uint *)((long)in_RDI + 100) = *(uint *)((long)in_RDI + 100) | 8;
  opj_event_msg_v2(in_RSI,4,"Error on writting stream!\n");
  return 1;
}

Assistant:

opj_bool opj_stream_flush (opj_stream_private_t * p_stream, opj_event_mgr_t * p_event_mgr)
{
	// the number of bytes written on the media.
	OPJ_SIZE_T l_current_write_nb_bytes = 0;
	p_stream->m_current_data = p_stream->m_stored_data;

	while
		(p_stream->m_bytes_in_buffer)
	{
		// we should do an actual write on the media
		l_current_write_nb_bytes = p_stream->m_write_fn(p_stream->m_current_data,p_stream->m_bytes_in_buffer,p_stream->m_user_data);
		if
			(l_current_write_nb_bytes == -1)
		{
			p_stream->m_status |= opj_stream_e_error;
			opj_event_msg_v2(p_event_mgr, EVT_INFO, "Error on writting stream!\n");

			return EXIT_FAILURE;
		}
		p_stream->m_current_data += l_current_write_nb_bytes;
		p_stream->m_bytes_in_buffer -= l_current_write_nb_bytes;
	}
	p_stream->m_current_data = p_stream->m_stored_data;
	return EXIT_SUCCESS;
}